

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmosSyncChannel_Mixer.cpp
# Opt level: O0

AtmosSyncChannelMixer * __thiscall ASDCP::AtmosSyncChannelMixer::Reset(AtmosSyncChannelMixer *this)

{
  bool bVar1;
  int iVar2;
  reference ppPVar3;
  long in_RSI;
  bool bVar4;
  Result_t local_b0 [120];
  PCMDataProviderInterface **local_38;
  __normal_iterator<ASDCP::PCMDataProviderInterface_**,_std::vector<ASDCP::PCMDataProviderInterface_*,_std::allocator<ASDCP::PCMDataProviderInterface_*>_>_>
  local_30;
  iterator lastInput;
  iterator it;
  AtmosSyncChannelMixer *this_local;
  Result_t *result;
  
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  __gnu_cxx::
  __normal_iterator<ASDCP::PCMDataProviderInterface_**,_std::vector<ASDCP::PCMDataProviderInterface_*,_std::allocator<ASDCP::PCMDataProviderInterface_*>_>_>
  ::__normal_iterator(&lastInput);
  local_30._M_current =
       (PCMDataProviderInterface **)
       std::
       vector<ASDCP::PCMDataProviderInterface_*,_std::allocator<ASDCP::PCMDataProviderInterface_*>_>
       ::end((vector<ASDCP::PCMDataProviderInterface_*,_std::allocator<ASDCP::PCMDataProviderInterface_*>_>
              *)(in_RSI + 8));
  local_38 = (PCMDataProviderInterface **)
             std::
             vector<ASDCP::PCMDataProviderInterface_*,_std::allocator<ASDCP::PCMDataProviderInterface_*>_>
             ::begin((vector<ASDCP::PCMDataProviderInterface_*,_std::allocator<ASDCP::PCMDataProviderInterface_*>_>
                      *)(in_RSI + 8));
  lastInput = (iterator)local_38;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&lastInput,&local_30);
    bVar4 = false;
    if (bVar1) {
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      bVar4 = -1 < iVar2;
    }
    if (!bVar4) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<ASDCP::PCMDataProviderInterface_**,_std::vector<ASDCP::PCMDataProviderInterface_*,_std::allocator<ASDCP::PCMDataProviderInterface_*>_>_>
              ::operator*(&lastInput);
    (*(*ppPVar3)->_vptr_PCMDataProviderInterface[5])(local_b0);
    Kumu::Result_t::operator=((Result_t *)this,local_b0);
    Kumu::Result_t::~Result_t(local_b0);
    __gnu_cxx::
    __normal_iterator<ASDCP::PCMDataProviderInterface_**,_std::vector<ASDCP::PCMDataProviderInterface_*,_std::allocator<ASDCP::PCMDataProviderInterface_*>_>_>
    ::operator++(&lastInput);
  }
  return this;
}

Assistant:

Result_t
ASDCP::AtmosSyncChannelMixer::Reset()
{
  Result_t result = RESULT_OK;
  SourceList::iterator it;
  SourceList::iterator lastInput = m_inputs.end();

  for ( it = m_inputs.begin(); it != lastInput && ASDCP_SUCCESS(result) ; ++it )
    result = (*it)->Reset();

  return result;
}